

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

bool __thiscall
crnlib::mip_level::pack_to_dxt
          (mip_level *this,image_u8 *img,pixel_format fmt,bool cook,pack_params *orig_params,
          orientation_flags_t orient_flags)

{
  int iVar1;
  dxt_image *this_00;
  EVP_PKEY_CTX *ctx;
  image_u8 tmp_img;
  pack_params p;
  image<crnlib::color_quad<unsigned_char,_int>_> iStack_98;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  progress_callback_func p_Stack_50;
  void *local_48;
  undefined8 uStack_40;
  task_pool *local_38;
  
  if ((int)fmt < 0x41315844) {
    if ((int)fmt < 0x32495441) {
      if ((int)fmt < 0x31545844) {
        if ((fmt != PIXEL_FMT_ETC1) && (fmt != PIXEL_FMT_DXT5A)) {
          return false;
        }
      }
      else if ((fmt != PIXEL_FMT_DXT1) && (fmt != PIXEL_FMT_ETC2)) {
        return false;
      }
    }
    else if ((int)fmt < 0x33545844) {
      if ((fmt != PIXEL_FMT_3DC) && (fmt != PIXEL_FMT_DXT2)) {
        return false;
      }
    }
    else if (((fmt != PIXEL_FMT_DXT3) && (fmt != PIXEL_FMT_DXT4)) && (fmt != PIXEL_FMT_DXT5)) {
      return false;
    }
  }
  else if ((int)fmt < 0x52784778) {
    if ((int)fmt < 0x52424741) {
      if ((fmt != PIXEL_FMT_DXT1A) && (fmt != PIXEL_FMT_ETC2A)) {
        return false;
      }
    }
    else if ((fmt != PIXEL_FMT_DXT5_AGBR) && (fmt != PIXEL_FMT_DXT5_xGBR)) {
      return false;
    }
  }
  else if ((int)fmt < 0x53413245) {
    if ((fmt != PIXEL_FMT_DXT5_xGxR) && (fmt != PIXEL_FMT_ETC1S)) {
      return false;
    }
  }
  else if (((fmt != PIXEL_FMT_ETC2AS) && (fmt != PIXEL_FMT_DXT5_CCxY)) && (fmt != PIXEL_FMT_DXN)) {
    return false;
  }
  local_38 = orig_params->m_pTask_pool;
  local_68._0_4_ = orig_params->m_dxt1a_alpha_threshold;
  local_68._4_4_ = orig_params->m_num_helper_threads;
  uStack_60._0_4_ = orig_params->m_quality;
  uStack_60._4_4_ = orig_params->m_compressor;
  local_58._0_1_ = orig_params->m_perceptual;
  local_58._1_1_ = orig_params->m_dithering;
  local_58._2_1_ = orig_params->m_grayscale_sampling;
  local_58._3_1_ = orig_params->m_use_both_block_types;
  local_58._4_1_ = orig_params->m_endpoint_caching;
  local_58._5_1_ = orig_params->m_use_transparent_indices_for_black;
  local_58._6_2_ = *(undefined2 *)&orig_params->field_0x16;
  p_Stack_50 = orig_params->m_pProgress_callback;
  local_48 = orig_params->m_pProgress_callback_user_data_ptr;
  uStack_40._0_4_ = orig_params->m_progress_start;
  uStack_40._4_4_ = orig_params->m_progress_range;
  if ((int)fmt < 0x52424778) {
    if (((fmt != PIXEL_FMT_DXT5A) && (fmt != PIXEL_FMT_3DC)) && (fmt != PIXEL_FMT_DXT5_AGBR))
    goto LAB_0012d83f;
LAB_0012d845:
    local_58 = local_58 & 0xffffffffffffff00;
  }
  else {
    if (0x59583240 < (int)fmt) {
      if ((fmt != PIXEL_FMT_DXN) && (fmt != PIXEL_FMT_DXT5_CCxY)) goto LAB_0012d83f;
      goto LAB_0012d845;
    }
    if ((fmt == PIXEL_FMT_DXT5_xGBR) || (fmt == PIXEL_FMT_DXT5_xGxR)) goto LAB_0012d845;
LAB_0012d83f:
    if ((img->m_comp_flags & 0x60) != 0) goto LAB_0012d845;
  }
  image<crnlib::color_quad<unsigned_char,_int>_>::image(&iStack_98,img);
  clear(this);
  this->m_format = fmt;
  if (cook) {
    cook_image(this,&iStack_98);
  }
  ctx = (EVP_PKEY_CTX *)0x0;
  if ((int)fmt < 0x41315844) {
    if ((int)fmt < 0x32495441) {
      if ((int)fmt < 0x31545844) {
        if (fmt == PIXEL_FMT_ETC1) {
          ctx = (EVP_PKEY_CTX *)0x7;
          goto LAB_0012da77;
        }
        if (fmt == PIXEL_FMT_DXT5A) goto LAB_0012d948;
      }
      else {
        if (fmt == PIXEL_FMT_DXT1) goto LAB_0012da77;
        if (fmt == PIXEL_FMT_ETC2) {
LAB_0012d9ae:
          ctx = (EVP_PKEY_CTX *)0x8;
          goto LAB_0012da77;
        }
      }
    }
    else if ((int)fmt < 0x33545844) {
LAB_0012d977:
      if (fmt == PIXEL_FMT_3DC) {
        ctx = (EVP_PKEY_CTX *)0x6;
        goto LAB_0012da77;
      }
      if (fmt == PIXEL_FMT_DXT2) goto LAB_0012d98b;
    }
    else {
      if (fmt == PIXEL_FMT_DXT3) {
LAB_0012d98b:
        ctx = (EVP_PKEY_CTX *)0x2;
        goto LAB_0012da77;
      }
      if ((fmt == PIXEL_FMT_DXT4) || (fmt == PIXEL_FMT_DXT5)) goto LAB_0012da71;
    }
  }
  else if ((int)fmt < 0x52784778) {
    if ((int)fmt < 0x41787878) {
      if (fmt == PIXEL_FMT_DXT1A) {
LAB_0012da3c:
        ctx = (EVP_PKEY_CTX *)0x1;
        goto LAB_0012da77;
      }
      if (fmt == PIXEL_FMT_ETC2A) {
LAB_0012d9cd:
        ctx = (EVP_PKEY_CTX *)0x9;
        goto LAB_0012da77;
      }
    }
    else if (fmt == PIXEL_FMT_A8) {
LAB_0012d948:
      if (((byte)iStack_98.m_comp_flags & 8) == 0) {
        image<crnlib::color_quad<unsigned_char,_int>_>::set_alpha_to_luma(&iStack_98);
      }
      if ((int)fmt < 0x33545844) {
        if (0x32435444 < (int)fmt) {
          if (fmt == PIXEL_FMT_ETC2) goto LAB_0012d9ae;
          goto LAB_0012d977;
        }
        if (fmt == PIXEL_FMT_DXT5A) {
          ctx = (EVP_PKEY_CTX *)0x4;
          goto LAB_0012da77;
        }
        if (fmt == PIXEL_FMT_DXT1) goto LAB_0012da77;
      }
      else if ((int)fmt < 0x35545844) {
        if (fmt == PIXEL_FMT_DXT3) goto LAB_0012d98b;
        if (fmt == PIXEL_FMT_DXT4) goto LAB_0012da71;
      }
      else {
        if (fmt == PIXEL_FMT_DXT5) {
LAB_0012da71:
          ctx = (EVP_PKEY_CTX *)0x3;
          goto LAB_0012da77;
        }
        if (fmt == PIXEL_FMT_ETC2A) goto LAB_0012d9cd;
        if (fmt == PIXEL_FMT_DXT1A) goto LAB_0012da3c;
      }
    }
    else if ((fmt == PIXEL_FMT_DXT5_AGBR) || (fmt == PIXEL_FMT_DXT5_xGBR)) goto LAB_0012da71;
  }
  else if ((int)fmt < 0x53413245) {
    if (fmt == PIXEL_FMT_DXT5_xGxR) goto LAB_0012da71;
    if (fmt == PIXEL_FMT_ETC1S) {
      ctx = (EVP_PKEY_CTX *)0xa;
      goto LAB_0012da77;
    }
  }
  else {
    if (fmt == PIXEL_FMT_ETC2AS) {
      ctx = (EVP_PKEY_CTX *)0xb;
      goto LAB_0012da77;
    }
    if (fmt == PIXEL_FMT_DXN) {
      ctx = (EVP_PKEY_CTX *)0x5;
      goto LAB_0012da77;
    }
    if (fmt == PIXEL_FMT_DXT5_CCxY) goto LAB_0012da71;
  }
  ctx = (EVP_PKEY_CTX *)0xffffffff;
LAB_0012da77:
  this_00 = (dxt_image *)crnlib_malloc(0x48);
  dxt_image::dxt_image(this_00);
  iVar1 = dxt_image::init(this_00,ctx);
  if ((char)iVar1 == '\0') {
    clear(this);
  }
  else {
    assign(this,this_00,fmt,orient_flags);
  }
  if (iStack_98.m_pixel_buf.m_p != (color_quad<unsigned_char,_int> *)0x0) {
    crnlib_free(iStack_98.m_pixel_buf.m_p);
  }
  return (bool)(char)iVar1;
}

Assistant:

bool mip_level::pack_to_dxt(const image_u8& img, pixel_format fmt, bool cook, const dxt_image::pack_params& orig_params, orientation_flags_t orient_flags) {
  CRNLIB_ASSERT(pixel_format_helpers::is_dxt(fmt));
  if (!pixel_format_helpers::is_dxt(fmt))
    return false;

  dxt_image::pack_params p(orig_params);
  if (pixel_format_helpers::is_pixel_format_non_srgb(fmt) || (img.get_comp_flags() & pixel_format_helpers::cCompFlagNormalMap) || (img.get_comp_flags() & pixel_format_helpers::cCompFlagLumaChroma)) {
    // Disable perceptual colorspace metrics when packing to swizzled or non-RGB pixel formats.
    p.m_perceptual = false;
  }

  image_u8 tmp_img(img);

  clear();

  m_format = fmt;

  if (cook)
    cook_image(tmp_img);

  if ((pixel_format_helpers::is_alpha_only(fmt)) && (!tmp_img.has_alpha()))
    tmp_img.set_alpha_to_luma();

  dxt_format dxt_fmt = pixel_format_helpers::get_dxt_format(fmt);

  dxt_image* pDXT_image = crnlib_new<dxt_image>();
  if (!pDXT_image->init(dxt_fmt, tmp_img, p)) {
    clear();
    return false;
  }

  assign(pDXT_image, fmt, orient_flags);

  return true;
}